

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O1

bool duckdb::AlpAnalyze<double>(AnalyzeState *state,Vector *input,idx_t count)

{
  AnalyzeState *pAVar1;
  value_type vVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  uint uVar5;
  reference pvVar6;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  ulong uVar10;
  size_type __n;
  unsigned_long val;
  ulong __n_00;
  size_type sVar11;
  size_type sVar12;
  double dVar13;
  undefined8 uVar14;
  vector<double,_true> current_vector_values;
  vector<double,_true> current_vector_sample;
  vector<unsigned_short,_true> current_vector_null_positions;
  UnifiedVectorFormat vdata;
  allocator_type local_d1;
  vector<double,_std::allocator<double>_> local_d0;
  vector<double,_std::allocator<double>_> local_b8;
  AnalyzeState *local_a0;
  value_type_conflict7 local_98;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  UnifiedVectorFormat local_78;
  
  pp_Var3 = state[3]._vptr_AnalyzeState;
  if (0x2492492492492492 < (ulong)((long)pp_Var3 * 0x6db6db6db6db6db7)) {
    state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var3 + 1);
    state[2].info.block_manager =
         (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
    return true;
  }
  pp_Var4 = state[2]._vptr_AnalyzeState;
  state[2].info.block_manager =
       (BlockManager *)((long)&(state[2].info.block_manager)->_vptr_BlockManager + count);
  state[3]._vptr_AnalyzeState = (_func_int **)((long)pp_Var3 + 1);
  if ((count < 0x20) && (pp_Var4 != (_func_int **)0x0)) {
    return true;
  }
  local_a0 = state;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,count,&local_78);
  val = 0x400;
  if (count < 0x400) {
    val = count;
  }
  uVar5 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(val);
  __n_00 = (ulong)uVar5;
  dVar13 = ceil((double)__n_00 * 0.03125);
  uVar10 = 1;
  if (1 < (uint)(long)dVar13) {
    uVar10 = (long)dVar13 & 0xffffffff;
  }
  dVar13 = ceil((double)__n_00 / (double)uVar10);
  local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start._0_2_ = 0;
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_90,__n_00,(value_type_conflict6 *)&local_d0,(allocator_type *)&local_b8);
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_d0,__n_00,(value_type_conflict7 *)&local_b8,(allocator_type *)&local_98);
  local_98 = 0.0;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_b8,(long)dVar13 & 0xffffffff,&local_98,&local_d1);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (uVar5 == 0) goto LAB_010514ba;
    sVar11 = 0;
    do {
      sVar12 = sVar11;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        sVar12 = (size_type)(local_78.sel)->sel_vector[sVar11];
      }
      vVar2 = *(value_type *)(local_78.data + sVar12 * 8);
      pvVar7 = vector<double,_true>::operator[]((vector<double,_true> *)&local_d0,sVar11);
      *pvVar7 = vVar2;
      sVar11 = sVar11 + 1;
    } while (__n_00 != sVar11);
  }
  else {
    if (uVar5 == 0) {
      __n = 0;
    }
    else {
      sVar11 = 0;
      __n = 0;
      do {
        sVar12 = sVar11;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          sVar12 = (size_type)(local_78.sel)->sel_vector[sVar11];
        }
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)((local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask[sVar12 >> 6] >> (sVar12 & 0x3f) & 1) == 0);
        }
        vVar2 = *(value_type *)(local_78.data + sVar12 * 8);
        pvVar6 = vector<unsigned_short,_true>::operator[]
                           ((vector<unsigned_short,_true> *)&local_90,__n);
        *pvVar6 = (value_type)sVar11;
        pvVar7 = vector<double,_true>::operator[]((vector<double,_true> *)&local_d0,sVar11);
        __n = uVar8 + __n;
        *pvVar7 = vVar2;
        sVar11 = sVar11 + 1;
      } while (__n_00 != sVar11);
    }
    if (__n != 0) {
      uVar14 = 0;
      if (uVar5 != 0) {
        uVar8 = 0;
        do {
          if (uVar8 != local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar8]) {
            uVar14 = *(undefined8 *)
                      (CONCAT62(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start._2_6_,
                                local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start._0_2_) + uVar8 * 8);
            break;
          }
          uVar8 = uVar8 + 1;
        } while (__n_00 != uVar8);
      }
      sVar9 = 0;
      do {
        *(undefined8 *)
         (CONCAT62(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start._2_6_,
                   local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start._0_2_) +
         (ulong)local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_start[sVar9] * 8) = uVar14;
        sVar9 = sVar9 + 1;
      } while (__n != sVar9);
    }
  }
  if (uVar5 != 0) {
    sVar12 = 0;
    sVar11 = 0;
    do {
      pvVar7 = vector<double,_true>::operator[]((vector<double,_true> *)&local_d0,sVar12);
      vVar2 = *pvVar7;
      pvVar7 = vector<double,_true>::operator[]((vector<double,_true> *)&local_b8,sVar11);
      *pvVar7 = vVar2;
      sVar11 = sVar11 + 1;
      sVar12 = sVar12 + uVar10;
    } while ((__n_00 - 1) / uVar10 + 1 != sVar11);
  }
LAB_010514ba:
  pAVar1 = local_a0;
  ::std::vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>>::
  emplace_back<duckdb::vector<double,true>>
            ((vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>> *)
             (local_a0 + 5),(vector<double,_true> *)&local_d0);
  ::std::vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>>::
  emplace_back<duckdb::vector<double,true>>
            ((vector<duckdb::vector<double,true>,std::allocator<duckdb::vector<double,true>>> *)
             &pAVar1[3].info,(vector<double,_true> *)&local_b8);
  pAVar1 = pAVar1 + 2;
  pAVar1->_vptr_AnalyzeState = (_func_int **)((long)pAVar1->_vptr_AnalyzeState + 1);
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT62(local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._2_6_,
                       local_d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start._0_2_) != (void *)0x0) {
    operator_delete((void *)CONCAT62(local_d0.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._2_6_,
                                     local_d0.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_2_));
  }
  if (local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return true;
}

Assistant:

bool AlpAnalyze(AnalyzeState &state, Vector &input, idx_t count) {
	auto &analyze_state = (AlpAnalyzeState<T> &)state;
	bool must_skip_current_vector = alp::AlpUtils::MustSkipSamplingFromCurrentVector(
	    analyze_state.vectors_count, analyze_state.vectors_sampled_count, count);
	analyze_state.vectors_count += 1;
	analyze_state.total_values_count += count;
	if (must_skip_current_vector) {
		return true;
	}

	UnifiedVectorFormat vdata;
	input.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<T>(vdata);

	alp::AlpSamplingParameters sampling_params = alp::AlpUtils::GetSamplingParameters(count);

	vector<uint16_t> current_vector_null_positions(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_values(sampling_params.n_lookup_values, 0);
	vector<T> current_vector_sample(sampling_params.n_sampled_values, 0);

	// Storing the entire sampled vector
	//! We need to store the entire sampled vector to perform the 'analyze' compression in it
	idx_t nulls_idx = 0;
	// We optimize by doing a different loop when there are no nulls
	if (vdata.validity.AllValid()) {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			current_vector_values[i] = value;
		}
	} else {
		for (idx_t i = 0; i < sampling_params.n_lookup_values; i++) {
			auto idx = vdata.sel->get_index(i);
			T value = data[idx];
			//! We resolve null values with a predicated comparison
			bool is_null = !vdata.validity.RowIsValid(idx);
			current_vector_null_positions[nulls_idx] = UnsafeNumericCast<uint16_t>(i);
			nulls_idx += is_null;
			current_vector_values[i] = value;
		}
		alp::AlpUtils::FindAndReplaceNullsInVector<T>(current_vector_values.data(),
		                                              current_vector_null_positions.data(),
		                                              sampling_params.n_lookup_values, nulls_idx);
	}

	// Storing the sample of that vector
	idx_t sample_idx = 0;
	for (idx_t i = 0; i < sampling_params.n_lookup_values; i += sampling_params.n_sampled_increments) {
		current_vector_sample[sample_idx] = current_vector_values[i];
		sample_idx++;
	}
	D_ASSERT(sample_idx == sampling_params.n_sampled_values);

	//! A std::move is needed to avoid a copy of the pushed vector
	analyze_state.complete_vectors_sampled.push_back(std::move(current_vector_values));
	analyze_state.rowgroup_sample.push_back(std::move(current_vector_sample));
	analyze_state.vectors_sampled_count++;
	return true;
}